

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  HttpInputStreamImpl *this_01;
  HttpEntityBodyReader *this_02;
  PromiseArenaMember *node;
  char *pcVar1;
  undefined8 uVar2;
  SourceLocation location;
  String *description;
  PromiseAwaiter<unsigned_long> *this_03;
  bool bVar3;
  coroutine_handle<void> coroutine;
  Coroutine<unsigned_long> *pCVar4;
  long lVar5;
  long in_R8;
  unsigned_long *in_R9;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Fault local_1f0;
  unsigned_long *local_1e8;
  String *local_1e0;
  FixVoid<unsigned_long> *local_1d8;
  Exception *local_1d0;
  PromiseAwaiter<unsigned_long> *local_1c8;
  Exception local_1c0;
  
  coroutine._M_fr_ptr = operator_new(0x468);
  *(code **)coroutine._M_fr_ptr = tryRead;
  *(code **)((long)coroutine._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(void **)((long)coroutine._M_fr_ptr + 0x438) = buffer;
  local_1c0.ownFile.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_1c0.ownFile.content.size_ = 0x5895d3;
  local_1c0.ownFile.content.disposer = (ArrayDisposer *)0x13000007c5;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x7c5;
  location.columnNumber = 0x13;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)this_00;
  local_1c0.ownFile.content.ptr = (char *)((long)buffer + 0x20);
  if (*(char *)((long)buffer + 0x20) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x7c6,FAILED,"clean",
               "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
               (DebugExpression<bool_&> *)&local_1c0,
               (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
    kj::_::Debug::Fault::fatal(&local_1f0);
  }
  local_1e8 = (unsigned_long *)((long)coroutine._M_fr_ptr + 0x428);
  *(undefined1 *)((long)buffer + 0x20) = 0;
  *local_1e8 = 0;
  if (*(long *)((long)buffer + 0x18) == 0) {
    *local_1c0.ownFile.content.ptr = '\x01';
    *(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x420) = 0;
    kj::_::Coroutine<unsigned_long>::fulfill
              (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x420));
LAB_003f4adb:
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x460) = 1;
  }
  else {
    local_1c8 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x240);
    local_1e0 = (String *)((long)coroutine._M_fr_ptr + 0x400);
    local_1d8 = (FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x418);
    this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x430);
    local_1d0 = (Exception *)((long)coroutine._M_fr_ptr + 0x260);
    pCVar4 = this_00;
    while( true ) {
      *(long *)((long)coroutine._M_fr_ptr + 0x458) = in_R8;
      *(size_t *)((long)coroutine._M_fr_ptr + 0x450) = maxBytes;
      *(size_t *)((long)coroutine._M_fr_ptr + 0x448) = minBytes;
      *(Coroutine<unsigned_long> **)((long)coroutine._M_fr_ptr + 0x440) = pCVar4;
      this_02 = *(HttpEntityBodyReader **)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 8);
      HttpEntityBodyReader::getInner(this_02);
      HttpInputStreamImpl::tryRead(this_01,this_02,minBytes,1);
      this_03 = local_1c8;
      co_await<unsigned_long>(local_1c8,(Promise<unsigned_long> *)this_01);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x460) = 0;
      bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        (&this_03->super_PromiseAwaiterBase,(CoroutineBase *)this_00);
      if (bVar3) break;
      pCVar4 = (Coroutine<unsigned_long> *)
               kj::_::PromiseAwaiter<unsigned_long>::await_resume(this_03);
      if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
        Exception::~Exception(local_1d0);
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase(&this_03->super_PromiseAwaiterBase);
      node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
      if (node != (PromiseArenaMember *)0x0) {
        (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose(node);
      }
      description = local_1e0;
      lVar5 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 0x18) - (long)pCVar4;
      *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 0x18) = lVar5;
      if (lVar5 == 0) {
        HttpEntityBodyReader::doneReading
                  (*(HttpEntityBodyReader **)((long)coroutine._M_fr_ptr + 0x438));
LAB_003f4ab0:
        *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 0x20) = 1;
        *(long *)((long)coroutine._M_fr_ptr + 0x418) =
             (long)&(pCVar4->super_CoroutineBase).super_PromiseNode.super_PromiseArenaMember.
                    _vptr_PromiseArenaMember + *(long *)((long)coroutine._M_fr_ptr + 0x428);
        kj::_::Coroutine<unsigned_long>::fulfill(this_00,local_1d8);
        goto LAB_003f4adb;
      }
      if (pCVar4 == (Coroutine<unsigned_long> *)0x0) {
        local_1f0.exception = (Exception *)(lVar5 + *local_1e8);
        kj::_::Debug::makeDescription<char_const(&)[64],unsigned_long&,unsigned_long&>
                  (local_1e0,
                   (Debug *)
                   "\"premature EOF in HTTP entity body; did not reach Content-Length\", expectedLength, alreadyRead"
                   ,"premature EOF in HTTP entity body; did not reach Content-Length",
                   (char (*) [64])&local_1f0,local_1e8,in_R9);
        Exception::Exception
                  (&local_1c0,DISCONNECTED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x7df,description);
        throwRecoverableException(&local_1c0,0);
        Exception::~Exception(&local_1c0);
        pcVar1 = (description->content).ptr;
        if (pcVar1 != (char *)0x0) {
          uVar2 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408);
          (description->content).ptr = (char *)0x0;
          (description->content).size_ = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x410))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x410),pcVar1,1,uVar2,uVar2,0);
        }
        goto LAB_003f4ab0;
      }
      maxBytes = (long)*(Coroutine<unsigned_long> **)((long)coroutine._M_fr_ptr + 0x450) -
                 (long)pCVar4;
      if (*(Coroutine<unsigned_long> **)((long)coroutine._M_fr_ptr + 0x450) < pCVar4 ||
          maxBytes == 0) goto LAB_003f4ab0;
      minBytes = (long)&(pCVar4->super_CoroutineBase).super_PromiseNode.super_PromiseArenaMember.
                        _vptr_PromiseArenaMember + *(long *)((long)coroutine._M_fr_ptr + 0x448);
      in_R8 = *(long *)((long)coroutine._M_fr_ptr + 0x458) - (long)pCVar4;
      *(long *)((long)coroutine._M_fr_ptr + 0x428) =
           (long)&(pCVar4->super_CoroutineBase).super_PromiseNode.super_PromiseArenaMember.
                  _vptr_PromiseArenaMember + *(long *)((long)coroutine._M_fr_ptr + 0x428);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (length == 0) {
        clean = true;
        co_return 0;
      }

      // We have to set minBytes to 1 here so that if we read any data at all, we update our
      // counter immediately, so that we still know where we are in case of cancellation.
      auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, length));

      length -= amount;
      if (length > 0) {
        // We haven't reached the end of the entity body yet.
        if (amount == 0) {
          size_t expectedLength = length + alreadyRead;
          kj::throwRecoverableException(KJ_EXCEPTION(
            DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length",
            expectedLength,
            alreadyRead
          ));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
      } else if (length == 0) {
        doneReading();
      }
      clean = true;
      co_return amount + alreadyRead;
    }
  }